

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void curve_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey
              ,int vis)

{
  t_pd p_Var1;
  int iVar2;
  _glist *p_Var3;
  char *pcVar4;
  uint uVar5;
  t_float tVar6;
  undefined8 in_stack_fffffffffffff818;
  uint uVar8;
  t_float *ptVar7;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffff820;
  long lVar10;
  undefined4 uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  undefined4 uVar15;
  int *piVar16;
  t_float local_778;
  int fill;
  t_word pix [200];
  int outline;
  t_float width;
  int closed;
  int flags;
  char *tags [3];
  char local_108 [8];
  char tag [80];
  char tag0 [80];
  t_pd local_60;
  _fielddesc *f;
  int n;
  int i;
  t_curve *x;
  int vis_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  f._0_4_ = *(int *)&z[0xd].g_next;
  _closed = local_108;
  tags[0] = tag + 0x48;
  tags[1] = "curve";
  if (vis != 0) {
    tVar6 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
    if ((tVar6 == 0.0) && (!NAN(tVar6))) {
      return;
    }
  }
  sprintf(tag + 0x48,"curve%lx",z);
  sprintf(local_108,"curve%lx_data%lx",z,data);
  if (vis == 0) {
    if (1 < (int)f) {
      p_Var3 = glist_getcanvas(glist);
      pdgui_vmess((char *)0x0,"crs",p_Var3,"delete",local_108);
    }
  }
  else if ((int)f < 2) {
    post("warning: drawing shapes need at least two points to be graphed");
  }
  else {
    p_Var1 = z[3].g_pd;
    pix[199]._4_4_ = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
    if (100 < (int)f) {
      f._0_4_ = 100;
    }
    f._4_4_ = 0;
    local_60 = z[0xe].g_pd;
    while( true ) {
      uVar5 = (uint)((ulong)in_stack_fffffffffffff820 >> 0x20);
      uVar8 = (uint)((ulong)in_stack_fffffffffffff818 >> 0x20);
      if ((int)f <= f._4_4_) break;
      tVar6 = fielddesc_getcoord((_fielddesc *)local_60,template,data,1);
      tVar6 = glist_xtopixels(glist,basex + tVar6);
      (&local_778)[(long)(f._4_4_ << 1) * 2] = tVar6;
      tVar6 = fielddesc_getcoord((_fielddesc *)&local_60->c_nmethod,template,data,1);
      tVar6 = glist_ytopixels(glist,basey + tVar6);
      (&local_778)[(long)(f._4_4_ * 2 + 1) * 2] = tVar6;
      f._4_4_ = f._4_4_ + 1;
      local_60 = (t_pd)&local_60->c_symbolmethod;
    }
    if ((float)pix[199]._4_4_ < 1.0) {
      pix[199]._4_4_ = 0x3f800000;
    }
    if ((*(ushort *)&glist->field_0xe8 >> 8 & 1) != 0) {
      iVar2 = glist_getzoom(glist);
      pix[199]._4_4_ = (float)iVar2 * (float)pix[199]._4_4_;
    }
    tVar6 = fielddesc_getfloat((_fielddesc *)(z + 6),template,data,1);
    pix[199]._0_4_ = numbertocolor((int)tVar6);
    p_Var3 = glist_getcanvas(glist);
    pcVar4 = "line";
    if (((ulong)p_Var1 & 1) != 0) {
      pcVar4 = "polygon";
    }
    piVar16 = &closed;
    lVar10 = (ulong)uVar5 << 0x20;
    uVar11 = 0;
    pcVar12 = "-width";
    pcVar13 = "-smooth";
    uVar5 = (uint)(((ulong)p_Var1 & 2) != 0);
    pcVar14 = "-tags";
    uVar15 = 3;
    pdgui_vmess((char *)0x0,"crr iiii rf ri rS",(double)(float)pix[199]._4_4_,p_Var3,"create",pcVar4
                ,0,(ulong)uVar8 << 0x20,lVar10,0,"-width","-smooth",uVar5,"-tags",3,piVar16);
    p_Var3 = glist_getcanvas(glist);
    ptVar7 = &local_778;
    pdgui_vmess((char *)0x0,"crs w",p_Var3,"coords",local_108,(ulong)(uint)((int)f << 1),ptVar7);
    uVar9 = (undefined4)((ulong)ptVar7 >> 0x20);
    if (((ulong)p_Var1 & 1) == 0) {
      p_Var3 = glist_getcanvas(glist);
      pdgui_vmess((char *)0x0,"crs rk",p_Var3,"itemconfigure",local_108,"-fill",
                  CONCAT44(uVar9,pix[199].w_index),lVar10,uVar11,pcVar12,pcVar13,uVar5,pcVar14,
                  uVar15,piVar16);
    }
    else {
      tVar6 = fielddesc_getfloat((_fielddesc *)&z[3].g_next,template,data,1);
      iVar2 = numbertocolor((int)tVar6);
      p_Var3 = glist_getcanvas(glist);
      pdgui_vmess((char *)0x0,"crs rk rk",p_Var3,"itemconfigure",local_108,"-fill",
                  CONCAT44(uVar9,iVar2),"-outline",pix[199].w_float);
    }
  }
  return;
}

Assistant:

static void curve_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    char tag0[80], tag[80];
    const char*tags[] = {tag, tag0, "curve"};
        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag0, "curve%lx", x);
    sprintf(tag , "curve%lx_data%lx", x, data);
    if (vis)
    {
        if (n > 1)
        {
            int flags = x->x_flags, closed = (flags & CLOSED);
            t_float width = fielddesc_getfloat(&x->x_width, template, data, 1);
            int outline;
            t_word pix[200];

            if (n > 100)
                n = 100;
                /* calculate the pixel values before we start printing
                out the TK message so that "error" printout won't be
                interspersed with it.  Only show up to 100 points so we don't
                have to allocate memory here. */
            for (i = 0, f = x->x_vec; i < n; i++, f += 2)
            {
                pix[2*i].w_float = glist_xtopixels(glist,
                    basex + fielddesc_getcoord(f, template, data, 1));
                pix[2*i+1].w_float = glist_ytopixels(glist,
                    basey + fielddesc_getcoord(f+1, template, data, 1));
            }
            if (width < 1) width = 1;
            if (glist->gl_isgraph)
                width *= glist_getzoom(glist);
            outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            pdgui_vmess(0, "crr iiii rf ri rS",
                glist_getcanvas(glist), "create",
                (flags & CLOSED)?"polygon":"line",
                0, 0, 0, 0,
                "-width", width,
                "-smooth", !!(flags & BEZ),
                "-tags", 3, tags);

            pdgui_vmess(0, "crs w",
                glist_getcanvas(glist), "coords", tag,
                2*n, pix);

            if (flags & CLOSED)
            {
                int fill = numbertocolor(
                    fielddesc_getfloat(&x->x_fillcolor, template, data, 1));
                pdgui_vmess(0, "crs rk rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", fill,
                    "-outline", outline);
            } else
                pdgui_vmess(0, "crs rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", outline);
        }
        else post("warning: drawing shapes need at least two points to be graphed");
    }
    else
    {
        if (n > 1)
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}